

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

int __thiscall
CGraphics_Threaded::LoadPNG
          (CGraphics_Threaded *this,CImageInfo *pImg,char *pFilename,int StorageType)

{
  int iVar1;
  long lVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  uint *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  uchar *pBuffer;
  int Error;
  IOHANDLE File;
  png_t Png;
  char aCompleteFilename [512];
  void *pvVar3;
  png_read_callback_t read_fun;
  png_t *in_stack_fffffffffffffd68;
  int local_24c;
  uint local_21c;
  uint local_218;
  char local_214;
  char local_213;
  undefined1 local_208 [512];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = (void *)0x0;
  read_fun = (png_read_callback_t)0x0;
  lVar2 = (**(code **)(**(long **)(in_RDI + 0x88) + 0x20))
                    (*(long **)(in_RDI + 0x88),in_RDX,1,in_ECX,local_208,0x200);
  if (lVar2 == 0) {
    dbg_msg("game/png","failed to open file. filename=\'%s\'",in_RDX);
    local_24c = 0;
  }
  else {
    png_init((png_alloc_t)0x0,(png_free_t)0x0);
    iVar1 = png_open_read(in_stack_fffffffffffffd68,read_fun,pvVar3);
    if (iVar1 == 0) {
      if (((local_214 == '\b') &&
          (((local_213 == '\x02' || (local_213 == '\x06')) && (local_21c < 0x2001)))) &&
         (local_218 < 0x2001)) {
        pvVar3 = mem_alloc(0);
        png_get_data(in_stack_fffffffffffffd68,(uchar *)read_fun);
        io_close((IOHANDLE)0x12f215);
        *in_RSI = local_21c;
        in_RSI[1] = local_218;
        if (local_213 == '\x02') {
          in_RSI[2] = 0;
        }
        else if (local_213 == '\x06') {
          in_RSI[2] = 1;
        }
        *(void **)(in_RSI + 4) = pvVar3;
        local_24c = 1;
      }
      else {
        dbg_msg("game/png","invalid format. filename=\'%s\'",local_208);
        io_close((IOHANDLE)0x12f1cb);
        local_24c = 0;
      }
    }
    else {
      dbg_msg("game/png","failed to read file. filename=\'%s\'",local_208);
      io_close((IOHANDLE)0x12f156);
      local_24c = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_24c;
}

Assistant:

int CGraphics_Threaded::LoadPNG(CImageInfo *pImg, const char *pFilename, int StorageType)
{
	// open file for reading
	char aCompleteFilename[IO_MAX_PATH_LENGTH];
	IOHANDLE File = m_pStorage->OpenFile(pFilename, IOFLAG_READ, StorageType, aCompleteFilename, sizeof(aCompleteFilename));
	if(!File)
	{
		dbg_msg("game/png", "failed to open file. filename='%s'", pFilename);
		return 0;
	}

	png_init(0, 0); // ignore_convention
	png_t Png; // ignore_convention
	int Error = png_open_read(&Png, 0, File); // ignore_convention
	if(Error != PNG_NO_ERROR)
	{
		dbg_msg("game/png", "failed to read file. filename='%s'", aCompleteFilename);
		io_close(File);
		return 0;
	}

	if(Png.depth != 8 || (Png.color_type != PNG_TRUECOLOR && Png.color_type != PNG_TRUECOLOR_ALPHA) || Png.width > (2<<12) || Png.height > (2<<12)) // ignore_convention
	{
		dbg_msg("game/png", "invalid format. filename='%s'", aCompleteFilename);
		io_close(File);
		return 0;
	}

	unsigned char *pBuffer = (unsigned char *)mem_alloc(Png.width * Png.height * Png.bpp); // ignore_convention
	png_get_data(&Png, pBuffer); // ignore_convention
	io_close(File);

	pImg->m_Width = Png.width; // ignore_convention
	pImg->m_Height = Png.height; // ignore_convention
	if(Png.color_type == PNG_TRUECOLOR) // ignore_convention
		pImg->m_Format = CImageInfo::FORMAT_RGB;
	else if(Png.color_type == PNG_TRUECOLOR_ALPHA) // ignore_convention
		pImg->m_Format = CImageInfo::FORMAT_RGBA;
	pImg->m_pData = pBuffer;
	return 1;
}